

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

Storage3D * allocateStorage(array<long,_3UL> sizes)

{
  int64_t iVar1;
  double *pdVar2;
  long lVar3;
  Storage3D *in_RDI;
  
  (in_RDI->sizes)._M_elems[2] = sizes._M_elems[0];
  (in_RDI->sizes)._M_elems[1] = sizes._M_elems[1];
  (in_RDI->sizes)._M_elems[0] = sizes._M_elems[2];
  (in_RDI->strides)._M_elems[2] = 1;
  (in_RDI->strides)._M_elems[1] = sizes._M_elems[0];
  lVar3 = sizes._M_elems[1] * sizes._M_elems[0];
  (in_RDI->strides)._M_elems[0] = lVar3;
  iVar1 = halo_width;
  in_RDI->offset = (sizes._M_elems[0] + lVar3 + 1) * halo_width;
  lVar3 = lVar3 * sizes._M_elems[2] - iVar1;
  pdVar2 = (double *)operator_new__(-(ulong)(lVar3 + 0x20U >> 0x3d != 0) | lVar3 * 8 + 0x100U);
  in_RDI->allocatedPtr = pdVar2;
  in_RDI->alignedPtr = pdVar2 + (0x20 - iVar1);
  return in_RDI;
}

Assistant:

Storage3D allocateStorage(const std::array<int64_t, 3> sizes) {
  Storage3D result;
  // initialize the size
  result.sizes[2] = sizes[0];
  result.sizes[1] = sizes[1];
  result.sizes[0] = sizes[2];
  // initialize the strides
  result.strides[2] = 1;
  result.strides[1] = result.sizes[2];
  result.strides[0] = result.sizes[2] * result.sizes[1];
  result.offset = halo_width * result.strides[0] +
                  halo_width * result.strides[1] +
                  halo_width * result.strides[2];
  const int64_t allocSize = sizes[0] * sizes[1] * sizes[2];
  result.allocatedPtr = new ElementType[allocSize + (32 - halo_width)];
  result.alignedPtr = &result.allocatedPtr[(32 - halo_width)];
  return result;
}